

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_destroy_header_memory
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x2ed3,
                  "OPJ_BOOL opj_j2k_destroy_header_memory(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream != (opj_stream_private_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos != 0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
      }
      (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
      return 1;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x2ed5,
                  "OPJ_BOOL opj_j2k_destroy_header_memory(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x2ed4,
                "OPJ_BOOL opj_j2k_destroy_header_memory(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_destroy_header_memory(opj_j2k_t * p_j2k,
        opj_stream_private_t *p_stream,
        opj_event_mgr_t * p_manager
                                             )
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_stream);
    OPJ_UNUSED(p_manager);

    if (p_j2k->m_specific_param.m_encoder.m_header_tile_data) {
        opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = 0;
    }

    p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;

    return OPJ_TRUE;
}